

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# offline-ekf-flexibility-estimation.hxx
# Opt level: O0

examples * __thiscall
stateObservation::examples::offlineEKFFlexibilityEstimation
          (examples *this,IndexedMatrixArray *y,Matrix *xh0,uint numberOfContacts,
          vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          *contactsPositions,double dt)

{
  uint uVar1;
  uint uVar2;
  ConstantReturnType local_e0;
  Matrix local_c8;
  uint local_9c;
  undefined1 local_98 [4];
  uint k;
  IndexedMatrixArray u;
  uint inputSize;
  double dt_local;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *contactsPositions_local;
  uint numberOfContacts_local;
  Matrix *xh0_local;
  IndexedMatrixArray *y_local;
  
  stateObservation::IndexedMatrixArray::IndexedMatrixArray((IndexedMatrixArray *)local_98);
  local_9c = IndexedMatrixArray::getFirstIndex(y);
  local_9c = local_9c - 1;
  while( true ) {
    uVar1 = local_9c;
    uVar2 = IndexedMatrixArray::getLastIndex(y);
    if (uVar2 < uVar1) break;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero(&local_e0,0xf,1);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
              ((Matrix<double,_1,_1,0,_1,_1> *)&local_c8,
               (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&local_e0);
    IndexedMatrixArray::setValue((IndexedMatrixArray *)local_98,&local_c8,local_9c);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_c8);
    local_9c = local_9c + 1;
  }
  offlineEKFFlexibilityEstimation
            ((IndexedMatrixArray *)this,y,(Matrix *)local_98,(uint)xh0,
             (vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)(ulong)numberOfContacts,dt,(IndexedMatrixArray *)contactsPositions,
             (IndexedMatrixArray *)0x0);
  IndexedMatrixArray::~IndexedMatrixArray((IndexedMatrixArray *)local_98);
  return this;
}

Assistant:

stateObservation::IndexedMatrixArray offlineEKFFlexibilityEstimation(
            const stateObservation::IndexedMatrixArray & y,
            const Matrix & xh0,
            unsigned numberOfContacts,
            const std::vector<Vector3, Eigen::aligned_allocator<Vector3> > & contactsPositions,
            double dt)
{
    const unsigned inputSize=15;

    ///initialization of a zero input
    stateObservation::IndexedMatrixArray u;
    for (unsigned k=y.getFirstIndex()-1; k<=y.getLastIndex(); ++k)
    {
        u.setValue(Vector::Zero(inputSize,1),k);
    }

    return offlineEKFFlexibilityEstimation
                        (y, u, xh0, numberOfContacts, contactsPositions, dt);
}